

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_utils.cpp
# Opt level: O0

void * PEGetPDBPath_abi_cxx11_(void *data,size_t size)

{
  bool bVar1;
  int *piVar2;
  size_t in_RDX;
  allocator local_92;
  allocator local_91;
  int *local_90;
  PE_DEBUGTYPE_CODEVIEW *info;
  ulong uStack_80;
  int ei;
  size_t entryCount;
  PE_IMAGE_DEBUG_DIRECTORY *entries;
  char *sectionBasePtr;
  long lStack_60;
  int i;
  PE_IMAGE_SECTION_HEADER *section;
  PE_IMAGE_DATA_DIRECTORY *local_50;
  PE_IMAGE_DATA_DIRECTORY *debugDir;
  PE_IMAGE_NT_HEADERS *ntHeader;
  PE_IMAGE_DOS_HEADER *dosHeader;
  allocator local_21 [9];
  size_t size_local;
  void *data_local;
  
  size_local = size;
  data_local = data;
  bVar1 = PEIsValidFile((void *)size,in_RDX);
  if (bVar1) {
    ntHeader = (PE_IMAGE_NT_HEADERS *)size_local;
    debugDir = (PE_IMAGE_DATA_DIRECTORY *)(size_local + (long)*(int *)(size_local + 0x3c));
    local_50 = debugDir + 0x17;
    if (debugDir[0x17].size == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)data,"",(allocator *)((long)&section + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&section + 7));
    }
    else {
      lStack_60 = (long)&debugDir[3].va + (ulong)(ushort)debugDir[2].size;
      for (sectionBasePtr._4_4_ = 0;
          sectionBasePtr._4_4_ < (int)(uint)*(ushort *)((long)&debugDir->size + 2);
          sectionBasePtr._4_4_ = sectionBasePtr._4_4_ + 1) {
        if ((*(uint *)(lStack_60 + 0xc) <= local_50->va) &&
           (local_50->va + debugDir[0x17].size <=
            (uint)(*(int *)(lStack_60 + 0xc) + *(int *)(lStack_60 + 0x10)))) {
          entries = (PE_IMAGE_DEBUG_DIRECTORY *)
                    ((size_local + *(uint *)(lStack_60 + 0x14)) - (ulong)*(uint *)(lStack_60 + 0xc))
          ;
          entryCount = (long)&entries->Characteristics + (ulong)local_50->va;
          uStack_80 = (ulong)debugDir[0x17].size / 0x1c;
          for (info._4_4_ = 0; (ulong)(long)info._4_4_ < uStack_80; info._4_4_ = info._4_4_ + 1) {
            if ((*(int *)(entryCount + (long)info._4_4_ * 0x1c + 0xc) == 2) &&
               (local_90 = (int *)((long)&entries->Characteristics +
                                  (ulong)*(uint *)(entryCount + (long)info._4_4_ * 0x1c + 0x14)),
               *local_90 == 0x53445352)) {
              piVar2 = local_90 + 6;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)data,(char *)piVar2,&local_91);
              std::allocator<char>::~allocator((allocator<char> *)&local_91);
              return data;
            }
          }
        }
        lStack_60 = lStack_60 + 0x28;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)data,"",&local_92);
      std::allocator<char>::~allocator((allocator<char> *)&local_92);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)data,"",local_21);
    std::allocator<char>::~allocator((allocator<char> *)local_21);
  }
  return data;
}

Assistant:

std::string PEGetPDBPath(const void* data, size_t size)
{
    if (!PEIsValidFile(data, size))
        return "";

    const PE_IMAGE_DOS_HEADER* dosHeader = (const PE_IMAGE_DOS_HEADER*)data;
    const PE_IMAGE_NT_HEADERS* ntHeader = (PE_IMAGE_NT_HEADERS*)((const uint8_t*)data + dosHeader->ntHeader);

    const PE_IMAGE_DATA_DIRECTORY& debugDir = ntHeader->OptionalHeader.DataDirectory[IMAGE_DIRECTORY_ENTRY_DEBUG];
    if (debugDir.size == 0)
        return "";

    // find which section that is in
    const PE_IMAGE_SECTION_HEADER* section = IMAGE_FIRST_SECTION_IMPL(ntHeader);
    for (int i = 0; i < ntHeader->FileHeader.numberOfSections; ++i, ++section)
    {
        if ((debugDir.va < section->VirtualAddress) || (debugDir.va + debugDir.size > section->VirtualAddress + section->SizeOfRawData))
            continue; // not in this section

        const char* sectionBasePtr = (const char*)data + section->PointerToRawData - section->VirtualAddress;
        const PE_IMAGE_DEBUG_DIRECTORY* entries = (PE_IMAGE_DEBUG_DIRECTORY*)(sectionBasePtr + debugDir.va);
        size_t entryCount = debugDir.size / sizeof(PE_IMAGE_DEBUG_DIRECTORY);
        for (int ei = 0; ei < entryCount; ++ei)
        {
            if (entries[ei].Type == PE_IMAGE_DEBUG_TYPE_CODEVIEW)
            {
                const PE_DEBUGTYPE_CODEVIEW* info = (const PE_DEBUGTYPE_CODEVIEW*)(sectionBasePtr + entries[ei].AddressOfRawData);
                if (memcmp(&info->Signature, "RSDS", 4) == 0)
                {
                    return info->PdbFileName;
                }
            }
        }
    }

    return "";
}